

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetItemDefaultFocus(void)

{
  float fVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiWindow *window;
  ImGuiContext *g;
  float fVar8;
  float fVar9;
  float fVar10;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  if ((((pIVar4->Appearing == true) &&
       (pIVar5 = GImGui->NavWindow, pIVar5 == pIVar4->RootWindowForNav)) &&
      ((GImGui->NavInitRequest != false || (GImGui->NavInitResultId != 0)))) &&
     (GImGui->NavLayer == (pIVar5->DC).NavLayerCurrent)) {
    GImGui->NavInitRequest = false;
    pIVar6->NavInitResultId = (pIVar5->DC).LastItemId;
    IVar2 = (pIVar5->DC).LastItemRect.Min;
    IVar3 = (pIVar5->DC).LastItemRect.Max;
    fVar8 = (pIVar5->Pos).x;
    fVar9 = (pIVar5->Pos).y;
    (pIVar6->NavInitResultRectRel).Min.x = IVar2.x - fVar8;
    (pIVar6->NavInitResultRectRel).Min.y = IVar2.y - fVar9;
    (pIVar6->NavInitResultRectRel).Max.x = IVar3.x - fVar8;
    (pIVar6->NavInitResultRectRel).Max.y = IVar3.y - fVar9;
    pIVar6->NavAnyRequest = pIVar6->NavMoveRequest;
    bVar7 = IsItemVisible();
    if (!bVar7) {
      fVar8 = (pIVar4->DC).CursorPosPrevLine.y;
      fVar9 = (pIVar4->Pos).y;
      fVar1 = (pIVar4->DC).PrevLineHeight;
      fVar10 = (pIVar6->Style).ItemSpacing.y * 0.0;
      pIVar4->WriteAccessed = true;
      (pIVar4->ScrollTarget).y =
           (float)(int)(fVar1 * 0.5 + fVar10 + fVar10 + (fVar8 - fVar9) + (pIVar4->Scroll).y);
      (pIVar4->ScrollTargetCenterRatio).y = 0.5;
    }
  }
  return;
}

Assistant:

void ImGui::SetItemDefaultFocus()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (!window->Appearing)
        return;
    if (g.NavWindow == window->RootWindowForNav && (g.NavInitRequest || g.NavInitResultId != 0) && g.NavLayer == g.NavWindow->DC.NavLayerCurrent)
    {
        g.NavInitRequest = false;
        g.NavInitResultId = g.NavWindow->DC.LastItemId;
        g.NavInitResultRectRel = ImRect(g.NavWindow->DC.LastItemRect.Min - g.NavWindow->Pos, g.NavWindow->DC.LastItemRect.Max - g.NavWindow->Pos);
        NavUpdateAnyRequestFlag();
        if (!IsItemVisible())
            SetScrollHere();
    }
}